

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall
mocker::ir::Malloc::Malloc
          (Malloc *this,shared_ptr<mocker::ir::Reg> *dest,shared_ptr<mocker::ir::Addr> *size)

{
  shared_ptr<mocker::ir::Reg> local_30;
  shared_ptr<mocker::ir::Addr> *local_20;
  shared_ptr<mocker::ir::Addr> *size_local;
  shared_ptr<mocker::ir::Reg> *dest_local;
  Malloc *this_local;
  
  local_20 = size;
  size_local = (shared_ptr<mocker::ir::Addr> *)dest;
  dest_local = (shared_ptr<mocker::ir::Reg> *)this;
  IRInst::IRInst(&this->super_IRInst,Malloc);
  std::shared_ptr<mocker::ir::Reg>::shared_ptr(&local_30,dest);
  Definition::Definition(&this->super_Definition,&local_30);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_30);
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Malloc_00188590;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Malloc_001885b0;
  std::shared_ptr<mocker::ir::Addr>::shared_ptr(&this->size,size);
  return;
}

Assistant:

Malloc(std::shared_ptr<Reg> dest, std::shared_ptr<Addr> size)
      : IRInst(InstType::Malloc), Definition(std::move(dest)),
        size(std::move(size)) {}